

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# n2builder.cpp
# Opt level: O3

void __thiscall
icu_63::Normalizer2DataBuilder::setRoundTripMapping
          (Normalizer2DataBuilder *this,UChar32 c,UnicodeString *m)

{
  ushort uVar1;
  short sVar2;
  UBool UVar3;
  int32_t iVar4;
  Norm *p;
  UnicodeString *this_00;
  undefined8 extraout_RAX;
  Norm *size;
  void *p_00;
  char16_t *s;
  UMemory *unaff_R13;
  
  p_00 = (void *)(ulong)(uint)c;
  if ((c & 0xfffff800U) == 0xd800) {
    setRoundTripMapping();
  }
  else {
    UVar3 = isWellFormed(m);
    if (UVar3 != '\0') {
      uVar1 = (m->fUnion).fStackFields.fLengthAndFlags;
      if ((uVar1 & 0x11) == 0) {
        if ((uVar1 & 2) == 0) {
          s = (m->fUnion).fFields.fArray;
        }
        else {
          s = (m->fUnion).fStackFields.fBuffer;
        }
      }
      else {
        s = (char16_t *)0x0;
      }
      sVar2 = (m->fUnion).fStackFields.fLengthAndFlags;
      if (sVar2 < 0) {
        iVar4 = (m->fUnion).fFields.fLength;
      }
      else {
        iVar4 = (int)sVar2 >> 5;
      }
      iVar4 = u_countChar32_63(s,iVar4);
      if (iVar4 == 2) {
        p = Norms::createNorm(&this->norms,c);
        size = p;
        checkNormForMapping(this,p,c);
        this_00 = (UnicodeString *)UMemory::operator_new((UMemory *)0x40,(size_t)size);
        if (this_00 != (UnicodeString *)0x0) {
          UnicodeString::UnicodeString(this_00,m);
        }
        p->mapping = this_00;
        p->mappingType = ROUND_TRIP;
        p->mappingCP = -1;
        UnicodeSet::add(&(this->norms).mappingSet,c);
        return;
      }
      goto LAB_001dcf6e;
    }
  }
  setRoundTripMapping();
LAB_001dcf6e:
  setRoundTripMapping();
  UMemory::operator_delete(unaff_R13,p_00);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

void Normalizer2DataBuilder::setRoundTripMapping(UChar32 c, const UnicodeString &m) {
    if(U_IS_SURROGATE(c)) {
        fprintf(stderr,
                "error in gennorm2 phase %d: "
                "illegal round-trip mapping from surrogate code point U+%04lX\n",
                (int)phase, (long)c);
        exit(U_INVALID_FORMAT_ERROR);
    }
    if(!isWellFormed(m)) {
        fprintf(stderr,
                "error in gennorm2 phase %d: "
                "illegal round-trip mapping from U+%04lX to malformed string\n",
                (int)phase, (long)c);
        exit(U_INVALID_FORMAT_ERROR);
    }
    int32_t numCP=u_countChar32(toUCharPtr(m.getBuffer()), m.length());
    if(numCP!=2) {
        fprintf(stderr,
                "error in gennorm2 phase %d: "
                "illegal round-trip mapping from U+%04lX to %d!=2 code points\n",
                (int)phase, (long)c, (int)numCP);
        exit(U_INVALID_FORMAT_ERROR);
    }
    Norm *p=checkNormForMapping(norms.createNorm(c), c);
    p->mapping=new UnicodeString(m);
    p->mappingType=Norm::ROUND_TRIP;
    p->mappingCP=U_SENTINEL;
    norms.mappingSet.add(c);
}